

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O2

void dump_frame(FILE *fp,MppFrame frame,RK_U8 *tmp,RK_U32 w,RK_U32 h)

{
  ulong uVar1;
  size_t size;
  RK_U8 RVar2;
  MppFrameFormat MVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  MppBuffer buffer;
  ulong uVar7;
  RK_S64 RVar8;
  ulong uVar9;
  ulong uVar10;
  RK_U8 *base;
  uint uVar11;
  ulong uVar12;
  RK_U32 RVar13;
  uint uVar14;
  RK_U8 *pRVar15;
  RK_U8 *pRVar16;
  int iVar17;
  RK_U32 local_94;
  RK_U8 *local_90;
  RK_U8 *local_78;
  ulong local_40;
  
  MVar3 = mpp_frame_get_fmt(frame);
  MVar3 = MVar3 & 0xfffff;
  RVar4 = mpp_frame_get_width(frame);
  local_94 = mpp_frame_get_height(frame);
  RVar5 = mpp_frame_get_hor_stride(frame);
  uVar9 = (ulong)RVar5;
  RVar6 = mpp_frame_get_ver_stride(frame);
  buffer = mpp_frame_get_buffer(frame);
  local_78 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(buffer,"dump_frame");
  if (tmp == (RK_U8 *)0x0) {
    uVar11 = 0;
    switch(MVar3) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P:
      uVar11 = RVar6 * RVar5 * 3 >> 1;
      break;
    case MPP_FMT_YUV420SP_10BIT:
      size = (ulong)RVar4 * 2;
      pRVar15 = (RK_U8 *)mpp_osal_malloc("dump_frame",size);
      if (pRVar15 == (RK_U8 *)0x0) {
        _mpp_log_l(4,"mpp_impl","tmp_line malloc fail",(char *)0x0);
        return;
      }
      base = local_78 + RVar6 * RVar5;
      uVar11 = RVar4 + 7 >> 3;
      pRVar16 = local_78;
      for (RVar5 = 0; RVar5 != local_94; RVar5 = RVar5 + 1) {
        for (RVar13 = 0; uVar11 != RVar13; RVar13 = RVar13 + 1) {
          rearrange_pix(pRVar15,pRVar16,RVar13);
        }
        fwrite(pRVar15,size,1,(FILE *)fp);
        pRVar16 = pRVar16 + uVar9;
      }
      for (uVar14 = 0; uVar14 != local_94 >> 1; uVar14 = uVar14 + 1) {
        for (RVar5 = 0; uVar11 != RVar5; RVar5 = RVar5 + 1) {
          rearrange_pix(pRVar15,base,RVar5);
        }
        fwrite(pRVar15,size,1,(FILE *)fp);
        base = base + uVar9;
      }
      mpp_osal_free("dump_frame",pRVar15);
      uVar11 = 0;
      break;
    case MPP_FMT_YUV422SP:
      uVar11 = RVar6 * RVar5 * 2;
      break;
    default:
      if (MVar3 == MPP_FMT_YUV444SP) {
        uVar11 = RVar6 * RVar5 * 3;
        break;
      }
    case MPP_FMT_YUV422SP_10BIT:
    }
  }
  else {
    if (h < RVar6 || w < RVar5) {
      uVar1 = (ulong)((w + RVar5) - 1) / (ulong)w;
      uVar11 = 0;
      uVar12 = (ulong)((h + RVar6) - 1) / (ulong)h;
      if ((uint)uVar12 < (uint)uVar1) {
        uVar12 = uVar1;
      }
      uVar1 = (ulong)RVar4;
      RVar4 = (uint)(uVar1 / uVar12) & 0xfffffffe;
      uVar7 = (ulong)RVar4;
      uVar14 = (uint)(local_94 / uVar12);
      local_94 = uVar14 & 0xfffffffe;
      iVar17 = (int)uVar12;
      pRVar15 = local_78;
      pRVar16 = tmp;
      for (; uVar11 < local_94; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 < uVar7; uVar10 = uVar10 + 1) {
          RVar2 = fetch_data(MVar3,pRVar15,iVar17 * (int)uVar10);
          pRVar16[uVar10] = RVar2;
        }
        pRVar16 = pRVar16 + uVar7;
        pRVar15 = pRVar15 + iVar17 * RVar5;
      }
      local_90 = local_78 + RVar6 * RVar5;
      local_40 = (ulong)(local_94 * RVar4);
      pRVar15 = tmp + local_40;
      for (uVar11 = 0; uVar11 < uVar14 >> 1; uVar11 = uVar11 + 1) {
        for (uVar10 = 0; uVar10 < uVar1 / uVar12 >> 1; uVar10 = uVar10 + 1) {
          RVar13 = (int)uVar10 * 2 * iVar17;
          RVar2 = fetch_data(MVar3,local_90,RVar13);
          pRVar15[uVar10 * 2] = RVar2;
          RVar2 = fetch_data(MVar3,local_90,RVar13 + 1);
          pRVar15[uVar10 * 2 + 1] = RVar2;
        }
        pRVar15 = pRVar15 + uVar7;
        local_90 = local_90 + iVar17 * RVar5;
      }
    }
    else if (MVar3 == MPP_FMT_YUV420SP_10BIT) {
      uVar1 = (ulong)RVar4;
      pRVar15 = tmp;
      pRVar16 = local_78;
      for (RVar13 = 0; RVar13 != local_94; RVar13 = RVar13 + 1) {
        for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
          RVar2 = fetch_data(1,pRVar16,(RK_U32)uVar12);
          pRVar15[uVar12] = RVar2;
        }
        pRVar15 = pRVar15 + uVar1;
        pRVar16 = pRVar16 + uVar9;
      }
      local_90 = local_78 + RVar6 * RVar5;
      local_40 = (ulong)(RVar4 * local_94);
      pRVar15 = tmp + local_40;
      for (uVar11 = 0; uVar11 != local_94 >> 1; uVar11 = uVar11 + 1) {
        for (uVar12 = 0; uVar1 != uVar12; uVar12 = uVar12 + 1) {
          RVar2 = fetch_data(1,local_90,(RK_U32)uVar12);
          pRVar15[uVar12] = RVar2;
        }
        pRVar15 = pRVar15 + uVar1;
        local_90 = local_90 + uVar9;
      }
    }
    else {
      local_40 = (ulong)(RVar4 * local_94);
    }
    uVar11 = (uint)(long)((double)local_40 * 1.5);
    local_78 = tmp;
  }
  RVar8 = mpp_frame_get_pts(frame);
  _mpp_log_l(4,"mpp_impl","dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",(char *)0x0,(ulong)RVar4
             ,(ulong)local_94,uVar9,(ulong)RVar6,RVar8);
  if (uVar11 != 0) {
    fwrite(local_78,1,(ulong)uVar11,(FILE *)fp);
  }
  fflush((FILE *)fp);
  return;
}

Assistant:

static void dump_frame(FILE *fp, MppFrame frame, RK_U8 *tmp, RK_U32 w, RK_U32 h)
{
    RK_U32 i = 0, j = 0;
    RK_U32 fmt = (mpp_frame_get_fmt(frame) & MPP_FRAME_FMT_MASK);
    RK_U32 width = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
    RK_U8 *p_buf = (RK_U8 *) mpp_buffer_get_ptr(mpp_frame_get_buffer(frame));

    RK_U8 *psrc = p_buf;
    RK_U8 *pdes = tmp;
    RK_U32 size = 0;

    if (pdes) {
        if (hor_stride > w || ver_stride > h) {
            RK_U32 step = MPP_MAX((hor_stride + w - 1) / w,
                                  (ver_stride + h - 1) / h);
            RK_U32 img_w = width / step;
            RK_U32 img_h = height / step;

            img_w -= img_w & 0x1;
            img_h -= img_h & 0x1;
            for (i = 0; i < img_h; i++) {
                for (j = 0; j < img_w; j++)
                    pdes[j] = fetch_data(fmt, psrc, j * step);
                pdes += img_w;
                psrc += step * hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + img_w * img_h;
            for (i = 0; i < (img_h / 2); i++) {
                for (j = 0; j < (img_w / 2); j++) {
                    pdes[2 * j + 0] = fetch_data(fmt, psrc, 2 * j * step + 0);
                    pdes[2 * j + 1] = fetch_data(fmt, psrc, 2 * j * step + 1);
                }
                pdes += img_w;
                psrc += step * hor_stride;
            }
            width = img_w;
            height = img_h;
        } else if (fmt == MPP_FMT_YUV420SP_10BIT) {
            for (i = 0; i < height; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
            psrc = p_buf + hor_stride * ver_stride;
            pdes = tmp + width * height;
            for (i = 0; i < height / 2; i++) {
                for (j = 0; j < width; j++)
                    pdes[j] = fetch_data(fmt, psrc, j);
                pdes += width;
                psrc += hor_stride;
            }
        }
        size = width * height * 1.5;
    } else {
        tmp = p_buf;
        switch (fmt) {
        case MPP_FMT_YUV420SP :
        case MPP_FMT_YUV420P : {
            size = hor_stride * ver_stride * 3 / 2;
        } break;
        case MPP_FMT_YUV422SP : {
            size = hor_stride * ver_stride * 2;
        } break;
        case MPP_FMT_YUV444SP : {
            size = hor_stride * ver_stride * 3;
        } break;
        case MPP_FMT_YUV420SP_10BIT : {
            RK_U8 *base_y = p_buf;
            RK_U8 *base_c = p_buf + hor_stride * ver_stride;
            RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

            if (!tmp_line) {
                mpp_log("tmp_line malloc fail");
                return;
            }

            for (i = 0; i < height; i++, base_y += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_y, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }

            for (i = 0; i < height / 2; i++, base_c += hor_stride) {
                for (j = 0; j < MPP_ALIGN(width, 8) / 8; j++)
                    rearrange_pix(tmp_line, base_c, j);
                fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
            }
            MPP_FREE(tmp_line);
        }
        default : break;
        }
    }
    mpp_log("dump_yuv: w:h [%d:%d] stride [%d:%d] pts %lld\n",
            width, height, hor_stride, ver_stride, mpp_frame_get_pts(frame));
    if (size)
        fwrite(tmp, 1, size, fp);
    fflush(fp);
}